

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall HSimplexNla::unapplyBasisMatrixRowScale(HSimplexNla *this,HVector *rhs)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  long in_RSI;
  HSimplexNla *in_RDI;
  HighsInt iRow;
  HighsInt iEntry;
  bool use_row_indices;
  HighsInt to_entry;
  vector<double,_std::allocator<double>_> *row_scale;
  int local_34;
  int local_24;
  int local_1c;
  vector<double,_std::allocator<double>_> *local_18;
  long local_10;
  
  if (in_RDI->scale_ != (HighsScale *)0x0) {
    local_18 = &in_RDI->scale_->row;
    local_10 = in_RSI;
    bVar2 = sparseLoopStyle(in_RDI,*(HighsInt *)(in_RSI + 4),in_RDI->lp_->num_row_,&local_1c);
    for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
      if (bVar2) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 8),(long)local_24);
        local_34 = *pvVar3;
      }
      else {
        local_34 = local_24;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_34);
      dVar1 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                          (long)local_34);
      *pvVar5 = *pvVar5 / dVar1;
    }
  }
  return;
}

Assistant:

void HSimplexNla::unapplyBasisMatrixRowScale(HVector& rhs) const {
  if (scale_ == NULL) return;
  const vector<double>& row_scale = scale_->row;
  HighsInt to_entry;
  const bool use_row_indices =
      sparseLoopStyle(rhs.count, lp_->num_row_, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_row_indices ? rhs.index[iEntry] : iEntry;
    rhs.array[iRow] /= row_scale[iRow];
  }
}